

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_acceptance.c
# Opt level: O0

REF_STATUS ref_acceptance_u(REF_NODE ref_node,char *function_name,REF_DBL *scalar)

{
  REF_DBL RVar1;
  int iVar2;
  uint uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int local_31c;
  double local_318;
  double local_310;
  double local_2d0;
  double local_2c8;
  double dStack_2a8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_DBL primitive_1 [5];
  REF_DBL mach;
  REF_DBL w_1;
  REF_DBL v_1;
  REF_DBL u_1;
  REF_DBL pressure;
  REF_DBL rho;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_DBL primitive [6];
  REF_DBL w;
  REF_DBL v;
  REF_DBL u;
  REF_DBL RStack_1f0;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_DBL vel;
  REF_DBL radius_3;
  REF_DBL r_4;
  double dStack_1d0;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_DBL scale_4;
  REF_DBL radius_2;
  REF_DBL r_3;
  REF_DBL yplus_2;
  REF_DBL uplus_3;
  double dStack_1a0;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_DBL scale_3;
  REF_DBL radius_1;
  REF_DBL r_2;
  REF_DBL yplus_1;
  REF_DBL uplus_2;
  REF_DBL z0;
  REF_DBL y0;
  REF_DBL x0;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_DBL hop;
  REF_DBL scale_2;
  REF_DBL center;
  REF_DBL radius;
  REF_DBL r_1;
  REF_DBL gap;
  REF_DBL yplus1;
  REF_DBL yplus0;
  double dStack_110;
  REF_INT step;
  REF_DBL combined;
  REF_DBL uplus_1;
  REF_DBL uplus1;
  REF_DBL uplus0;
  undefined8 uStack_e8;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL scale_1;
  REF_DBL yplus;
  REF_DBL uplus;
  REF_DBL offset;
  REF_DBL scale;
  REF_DBL nu;
  REF_DBL c;
  REF_DBL b;
  REF_DBL a;
  REF_DBL h;
  REF_DBL g;
  REF_DBL f;
  REF_DBL xz;
  REF_DBL eps;
  REF_DBL xyz;
  REF_DBL xy_2;
  REF_DBL xy_1;
  REF_DBL x3;
  REF_DBL xy;
  REF_DBL r;
  REF_DBL z;
  REF_DBL y;
  REF_DBL x;
  REF_DBL *pRStack_28;
  REF_INT node;
  REF_DBL *scalar_local;
  char *function_name_local;
  REF_NODE ref_node_local;
  
  x._4_4_ = 0;
  pRStack_28 = scalar;
  scalar_local = (REF_DBL *)function_name;
  function_name_local = (char *)ref_node;
  do {
    if (*(int *)(function_name_local + 4) <= x._4_4_) {
      return 0;
    }
    if (((-1 < x._4_4_) && (x._4_4_ < *(int *)(function_name_local + 4))) &&
       (-1 < *(long *)(*(long *)(function_name_local + 0x10) + (long)x._4_4_ * 8))) {
      y = *(REF_DBL *)(*(long *)(function_name_local + 0x38) + (long)(x._4_4_ * 0xf) * 8);
      z = *(REF_DBL *)(*(long *)(function_name_local + 0x38) + (long)(x._4_4_ * 0xf + 1) * 8);
      r = *(REF_DBL *)(*(long *)(function_name_local + 0x38) + (long)(x._4_4_ * 0xf + 2) * 8);
      iVar2 = strcmp((char *)scalar_local,"u5");
      if (iVar2 == 0) {
        dVar4 = pow(y,2.0);
        dVar5 = pow(z,2.0);
        dVar6 = pow(r,2.0);
        pRStack_28[x._4_4_] = dVar6 + dVar6 + dVar4 + dVar4 + dVar5 * 2.0;
      }
      else {
        iVar2 = strcmp((char *)scalar_local,"supcyl");
        if (iVar2 == 0) {
          dVar4 = sqrt(y * y + z * z);
          xy = dVar4 - 0.5;
          dVar4 = exp(xy * -50.0);
          pRStack_28[x._4_4_] = 1.0 - dVar4;
          if (y - -1.0 < z * 0.5 * z) {
            pRStack_28[x._4_4_] = 2.0;
          }
        }
        else {
          iVar2 = strcmp((char *)scalar_local,"combo1");
          if (iVar2 == 0) {
            x3 = (y + y + -1.0) * (z + z + -1.0);
            xy_1 = pow(y + y + -1.0,3.0);
            dVar4 = tanh(x3 * 15.0 + -xy_1);
            pRStack_28[x._4_4_] = dVar4;
          }
          else {
            iVar2 = strcmp((char *)scalar_local,"combo2");
            if (iVar2 == 0) {
              xy_2 = (y + y + -1.0) * (z + z + -1.0);
              dVar4 = tanh((xy_2 - 0.5) * 50.0);
              pRStack_28[x._4_4_] = dVar4;
            }
            else {
              iVar2 = strcmp((char *)scalar_local,"sin50xy");
              if (iVar2 == 0) {
                xyz = (y + y + -1.0) * (z + z + -1.0);
                local_2c8 = xyz;
                if (xyz <= 0.0) {
                  local_2c8 = -xyz;
                }
                if (0.0628318530717958 < local_2c8) {
                  local_2d0 = xyz;
                  if (xyz <= 0.0) {
                    local_2d0 = -xyz;
                  }
                  if (0.1256637061435916 < local_2d0) {
                    dVar4 = sin(xyz * 50.0);
                    pRStack_28[x._4_4_] = dVar4 * 0.01;
                  }
                  else {
                    dVar4 = sin(xyz * 50.0);
                    pRStack_28[x._4_4_] = dVar4;
                  }
                }
                else {
                  dVar4 = sin(xyz * 50.0);
                  pRStack_28[x._4_4_] = dVar4;
                }
              }
              else {
                iVar2 = strcmp((char *)scalar_local,"sinfun3");
                if (iVar2 == 0) {
                  eps = (y - 0.4) * (z - 0.4) * (r - 0.4);
                  if (-0.0628318530717958 < eps) {
                    if (0.1256637061435916 < eps) {
                      dVar4 = sin(eps * 50.0);
                      pRStack_28[x._4_4_] = dVar4 * 0.1;
                    }
                    else {
                      dVar4 = sin(eps * 50.0);
                      pRStack_28[x._4_4_] = dVar4;
                    }
                  }
                  else {
                    dVar4 = sin(eps * 50.0);
                    pRStack_28[x._4_4_] = dVar4 * 0.1;
                  }
                }
                else {
                  iVar2 = strcmp((char *)scalar_local,"sinatan3");
                  if (iVar2 == 0) {
                    xz = 0.1;
                    f = y * r;
                    dVar4 = sin(f * 50.0);
                    RVar1 = xz;
                    dVar5 = sin(z * 5.0);
                    dVar5 = atan(RVar1 / (dVar5 - (f + f)));
                    pRStack_28[x._4_4_] = dVar4 * 0.1 + dVar5;
                  }
                  else {
                    iVar2 = strcmp((char *)scalar_local,"tanh3");
                    if (iVar2 == 0) {
                      dVar4 = pow(y + 1.3,20.0);
                      dVar5 = pow(z - 0.3,9.0);
                      dVar4 = tanh(dVar4 * dVar5 * r);
                      pRStack_28[x._4_4_] = dVar4;
                    }
                    else {
                      iVar2 = strcmp((char *)scalar_local,"bl3");
                      if (iVar2 == 0) {
                        b = 1.0;
                        c = 1.0;
                        nu = 1.0;
                        scale = 0.01;
                        offset = -1.0;
                        uplus = 1.0;
                        dVar4 = exp(((1.0 - y) * -1.0) / 0.01);
                        dVar5 = exp(-b / scale);
                        g = (1.0 - dVar4) / (1.0 - dVar5);
                        dVar4 = exp((-c * (1.0 - z)) / scale);
                        dVar5 = exp(-c / scale);
                        h = (1.0 - dVar4) / (1.0 - dVar5);
                        dVar4 = exp((-nu * (1.0 - r)) / scale);
                        dVar5 = exp(-nu / scale);
                        a = (1.0 - dVar4) / (1.0 - dVar5);
                        pRStack_28[x._4_4_] = offset * g * h * a + uplus;
                      }
                      else {
                        iVar2 = strcmp((char *)scalar_local,"uplus");
                        if (iVar2 == 0) {
                          uStack_e8 = 0x40c3880000000000;
                          scale_1 = z * 10000.0;
                          uplus0._4_4_ = ref_phys_spalding_uplus(scale_1,&yplus);
                          if (uplus0._4_4_ != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                                   ,0x131,"ref_acceptance_u",(ulong)uplus0._4_4_,"uplus");
                            return uplus0._4_4_;
                          }
                          pRStack_28[x._4_4_] = y * 0.0005 * y + yplus;
                          uplus0._4_4_ = 0;
                        }
                        else {
                          iVar2 = strcmp((char *)scalar_local,"circgap");
                          if (iVar2 == 0) {
                            center = 1.0;
                            r_1 = 0.1;
                            scale_2 = -1.1;
                            hop = 10000.0;
                            _ref_private_macro_code_rss_2 = 25.0;
                            if (z <= 0.0) {
                              local_310 = -z;
                            }
                            else {
                              local_310 = z;
                            }
                            yplus1 = local_310 * 10000.0;
                            x0._4_4_ = ref_phys_spalding_uplus(yplus1,&uplus1);
                            if (x0._4_4_ != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                                     ,0x13d,"ref_acceptance_u",(ulong)x0._4_4_,"uplus");
                              return x0._4_4_;
                            }
                            radius = sqrt(y * y + (z - scale_2) * (z - scale_2));
                            gap = hop * (radius - center);
                            x0._0_4_ = ref_phys_spalding_uplus(gap,&uplus_1);
                            if (x0._0_4_ != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                                     ,0x140,"ref_acceptance_u",(ulong)x0._0_4_,"uplus");
                              return x0._0_4_;
                            }
                            if (uplus_1 <= uplus1) {
                              local_318 = uplus_1;
                            }
                            else {
                              local_318 = uplus1;
                            }
                            combined = local_318;
                            if ((int)local_318 + -0x19 < 0) {
                              local_31c = 0;
                            }
                            else {
                              local_31c = (int)local_318 + -0x19;
                            }
                            yplus0._4_4_ = local_31c;
                            dStack_110 = _ref_private_macro_code_rss_2 * (double)local_31c +
                                         local_318;
                            pRStack_28[x._4_4_] = dStack_110;
                            x0._0_4_ = 0;
                          }
                          else {
                            iVar2 = strcmp((char *)scalar_local,"sphuplus");
                            if (iVar2 == 0) {
                              y0 = 1.0;
                              z0 = 1.0;
                              uplus_2 = 1.0;
                              scale_3 = 0.5;
                              dStack_1a0 = 10000.0;
                              radius_1 = sqrt((r - 1.0) * (r - 1.0) +
                                              (y - 1.0) * (y - 1.0) + (z - 1.0) * (z - 1.0));
                              r_2 = dStack_1a0 * (radius_1 - scale_3);
                              uplus_3._4_4_ = ref_phys_spalding_uplus(r_2,&yplus_1);
                              if (uplus_3._4_4_ != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                                       ,0x14d,"ref_acceptance_u",(ulong)uplus_3._4_4_,"uplus");
                                return uplus_3._4_4_;
                              }
                              pRStack_28[x._4_4_] = yplus_1;
                              uplus_3._4_4_ = 0;
                            }
                            else {
                              iVar2 = strcmp((char *)scalar_local,"cyluplus");
                              if (iVar2 == 0) {
                                scale_4 = 0.5;
                                dStack_1d0 = 10000.0;
                                radius_2 = sqrt(y * y + z * z);
                                r_3 = dStack_1d0 * (radius_2 - scale_4);
                                r_4._4_4_ = ref_phys_spalding_uplus(r_3,&yplus_2);
                                if (r_4._4_4_ != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                                         ,0x156,"ref_acceptance_u",(ulong)r_4._4_4_,"uplus");
                                  return r_4._4_4_;
                                }
                                pRStack_28[x._4_4_] = yplus_2;
                                r_4._4_4_ = 0;
                              }
                              else {
                                iVar2 = strcmp((char *)scalar_local,"dist");
                                if (iVar2 == 0) {
                                  vel = 0.5;
                                  radius_3 = sqrt(y * y + z * z);
                                  pRStack_28[x._4_4_] = radius_3 - vel;
                                }
                                else {
                                  iVar2 = strcmp((char *)scalar_local,"parabola");
                                  if (iVar2 == 0) {
                                    dVar4 = tanh((-z * z + y) * 50.0);
                                    pRStack_28[x._4_4_] = dVar4;
                                  }
                                  else {
                                    iVar2 = strcmp((char *)scalar_local,"one");
                                    if (iVar2 == 0) {
                                      pRStack_28[x._4_4_] = 1.0;
                                    }
                                    else {
                                      iVar2 = strcmp((char *)scalar_local,"half");
                                      if (iVar2 == 0) {
                                        pRStack_28[x._4_4_] = 1.0;
                                        if (z < 0.5) {
                                          pRStack_28[x._4_4_] = 0.5;
                                        }
                                      }
                                      else {
                                        iVar2 = strcmp((char *)scalar_local,"lisbon");
                                        if (iVar2 == 0) {
                                          uVar3 = ref_acceptance_u_lisbon
                                                            (y,z,&stack0xfffffffffffffe10);
                                          if (uVar3 != 0) {
                                            printf("%s: %d: %s: %d %s\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                                                  ,0x166,"ref_acceptance_u",(ulong)uVar3,"lisbon");
                                            return uVar3;
                                          }
                                          pRStack_28[x._4_4_] = RStack_1f0;
                                        }
                                        else {
                                          iVar2 = strcmp((char *)scalar_local,"fp-sa");
                                          if (iVar2 == 0) {
                                            uVar3 = ref_acceptance_primal_fp_sa
                                                              (z,(REF_DBL *)&stack0xfffffffffffffdb8
                                                              );
                                            if (uVar3 != 0) {
                                              printf("%s: %d: %s: %d %s\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                                                  ,0x16b,"ref_acceptance_u",(ulong)uVar3,
                                                  "flat plate sa");
                                              return uVar3;
                                            }
                                            dVar4 = sqrt(primitive[2] * primitive[2] +
                                                         primitive[0] * primitive[0] +
                                                         primitive[1] * primitive[1]);
                                            pRStack_28[x._4_4_] = dVar4;
                                          }
                                          else {
                                            iVar2 = strcmp((char *)scalar_local,"trig");
                                            if (iVar2 != 0) {
                                              printf("%s: %d: %s %s\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                                                  ,0x181,"unknown user function",scalar_local);
                                              return 5;
                                            }
                                            y = *(REF_DBL *)
                                                 (*(long *)(function_name_local + 0x38) +
                                                 (long)(x._4_4_ * 0xf) * 8);
                                            z = *(REF_DBL *)
                                                 (*(long *)(function_name_local + 0x38) +
                                                 (long)(x._4_4_ * 0xf + 1) * 8);
                                            uVar3 = ref_acceptance_primal_trig
                                                              (*(REF_DBL *)
                                                                (*(long *)(function_name_local +
                                                                          0x38) +
                                                                (long)(x._4_4_ * 0xf) * 8),
                                                               *(REF_DBL *)
                                                                (*(long *)(function_name_local +
                                                                          0x38) +
                                                                (long)(x._4_4_ * 0xf + 1) * 8),
                                                               &stack0xfffffffffffffd58);
                                            RVar1 = primitive_1[3];
                                            dVar4 = dStack_2a8;
                                            if (uVar3 != 0) {
                                              printf("%s: %d: %s: %d %s\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                                                  ,0x178,"ref_acceptance_u",(ulong)uVar3,"coax");
                                              return uVar3;
                                            }
                                            dVar5 = sqrt(primitive_1[2] * primitive_1[2] +
                                                         primitive_1[0] * primitive_1[0] +
                                                         primitive_1[1] * primitive_1[1]);
                                            dVar4 = sqrt((RVar1 * 1.4) / dVar4);
                                            primitive_1[4] = dVar5 / dVar4;
                                            pRStack_28[x._4_4_] = primitive_1[4];
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    x._4_4_ = x._4_4_ + 1;
  } while( true );
}

Assistant:

REF_FCN static REF_STATUS ref_acceptance_u(REF_NODE ref_node,
                                           const char *function_name,
                                           REF_DBL *scalar) {
  REF_INT node;
  REF_DBL x, y, z;
  each_ref_node_valid_node(ref_node, node) {
    x = ref_node_xyz(ref_node, 0, node);
    y = ref_node_xyz(ref_node, 1, node);
    z = ref_node_xyz(ref_node, 2, node);
    if (strcmp(function_name, "u5") == 0) {
      scalar[node] = 2.0 * pow(x, 2) + 2.0 * pow(y, 2) + 2.0 * pow(z, 2);
    } else if (strcmp(function_name, "supcyl") == 0) {
      REF_DBL r;
      r = sqrt(x * x + y * y) - 0.5;
      scalar[node] = 1.0 - exp(-50.0 * r);
      if ((x - (-1.0)) < 0.5 * y * y) scalar[node] = 2.0;
    } else if (strcmp(function_name, "combo1") == 0) {
      REF_DBL xy, x3;
      xy = (2.0 * x - 1.0) * (2.0 * y - 1.0);
      x3 = pow((2.0 * x - 1.0), 3);
      scalar[node] = tanh(15.0 * xy - x3);
    } else if (strcmp(function_name, "combo2") == 0) {
      REF_DBL xy;
      xy = (2.0 * x - 1.0) * (2.0 * y - 1.0);
      scalar[node] = tanh(50.0 * (xy - 0.5));
    } else if (strcmp(function_name, "sin50xy") == 0) {
      REF_DBL xy;
      xy = (2.0 * x - 1.0) * (2.0 * y - 1.0);
      if (ABS(xy) <= (ref_math_pi / 50.0)) {
        scalar[node] = sin(50.0 * xy);
      } else if (ABS(xy) <= 2.0 * (ref_math_pi / 50.0)) {
        scalar[node] = sin(50.0 * xy);
      } else {
        scalar[node] = 0.01 * sin(50.0 * xy);
      }
    } else if (strcmp(function_name, "sinfun3") == 0) {
      REF_DBL xyz;
      xyz = (x - 0.4) * (y - 0.4) * (z - 0.4); /* sphere2 */
      if (xyz <= (-1.0 * ref_math_pi / 50.0)) {
        scalar[node] = 0.1 * sin(50. * xyz);
      } else if (xyz <= (2.0 * ref_math_pi / 50.0)) {
        scalar[node] = sin(50.0 * xyz);
      } else {
        scalar[node] = 0.1 * sin(50.0 * xyz);
      }
    } else if (strcmp(function_name, "sinatan3") == 0) {
      REF_DBL eps = 0.1;
      REF_DBL xz;
      xz = x * z;
      scalar[node] =
          0.1 * sin(50.0 * xz) + atan(eps / (sin(5.0 * y) - 2.0 * xz));
    } else if (strcmp(function_name, "tanh3") == 0) {
      scalar[node] = tanh(pow(x + 1.3, 20.0) * pow(y - 0.3, 9.0) * z);
    } else if (strcmp(function_name, "bl3") == 0) {
      REF_DBL f, g, h;
      REF_DBL a = 1.0;
      REF_DBL b = 1.0;
      REF_DBL c = 1.0;
      REF_DBL nu = 0.01;
      REF_DBL scale = -1;
      REF_DBL offset = 1;
      f = (1.0 - exp(-a * (1.0 - x) / nu)) / (1.0 - exp(-a / nu));
      g = (1.0 - exp(-b * (1.0 - y) / nu)) / (1.0 - exp(-b / nu));
      h = (1.0 - exp(-c * (1.0 - z) / nu)) / (1.0 - exp(-c / nu));
      scalar[node] = scale * f * g * h + offset;
    } else if (strcmp(function_name, "uplus") == 0) {
      REF_DBL uplus, yplus, scale;
      scale = 1.0e4;
      yplus = scale * y;
      RSS(ref_phys_spalding_uplus(yplus, &uplus), "uplus");
      scalar[node] = uplus + 5.0e-4 * x * x;
    } else if (strcmp(function_name, "circgap") == 0) {
      REF_DBL uplus0, uplus1, uplus, combined;
      REF_INT step;
      REF_DBL yplus0, yplus1, gap, r, radius, center, scale, hop;
      radius = 1.0;
      gap = 0.1;
      center = -gap - radius;
      scale = 1.0e4;
      hop = 25.0;
      yplus0 = scale * ABS(y);
      RSS(ref_phys_spalding_uplus(yplus0, &uplus0), "uplus");
      r = sqrt(x * x + (y - center) * (y - center));
      yplus1 = scale * (r - radius);
      RSS(ref_phys_spalding_uplus(yplus1, &uplus1), "uplus");
      uplus = MIN(uplus0, uplus1);
      step = MAX(0, (REF_INT)uplus - 25);
      combined = uplus + hop * (REF_DBL)step;
      scalar[node] = combined;
    } else if (strcmp(function_name, "sphuplus") == 0) {
      REF_DBL x0 = 1, y0 = 1, z0 = 1;
      REF_DBL uplus;
      REF_DBL yplus, r, radius, scale;
      radius = 0.5;
      scale = 1.0e4;
      r = sqrt((x - x0) * (x - x0) + (y - y0) * (y - y0) + (z - z0) * (z - z0));
      yplus = scale * (r - radius);
      RSS(ref_phys_spalding_uplus(yplus, &uplus), "uplus");
      scalar[node] = uplus;
    } else if (strcmp(function_name, "cyluplus") == 0) {
      REF_DBL uplus;
      REF_DBL yplus, r, radius, scale;
      radius = 0.5;
      scale = 1.0e4;
      r = sqrt(x * x + y * y);
      yplus = scale * (r - radius);
      RSS(ref_phys_spalding_uplus(yplus, &uplus), "uplus");
      scalar[node] = uplus;
    } else if (strcmp(function_name, "dist") == 0) {
      REF_DBL r, radius;
      radius = 0.5;
      r = sqrt(x * x + y * y);
      scalar[node] = (r - radius);
    } else if (strcmp(function_name, "parabola") == 0) {
      scalar[node] = tanh(50 * (x - y * y));
    } else if (strcmp(function_name, "one") == 0) {
      scalar[node] = 1.0;
    } else if (strcmp(function_name, "half") == 0) {
      scalar[node] = 1.0;
      if (y < 0.5) scalar[node] = 0.5;
    } else if (strcmp(function_name, "lisbon") == 0) {
      REF_DBL vel;
      RSS(ref_acceptance_u_lisbon(x, y, &vel), "lisbon");
      scalar[node] = vel;
    } else if (strcmp(function_name, "fp-sa") == 0) {
      REF_DBL u, v, w;
      REF_DBL primitive[6];
      RSS(ref_acceptance_primal_fp_sa(y, primitive), "flat plate sa");
      u = primitive[1];
      v = primitive[2];
      w = primitive[3];
      scalar[node] = sqrt(u * u + v * v + w * w);
    } else if (strcmp(function_name, "trig") == 0) {
      REF_DBL rho, pressure, u, v, w, mach;
      REF_DBL primitive[5];
      x = ref_node_xyz(ref_node, 0, node);
      y = ref_node_xyz(ref_node, 1, node);
      RSS(ref_acceptance_primal_trig(ref_node_xyz(ref_node, 0, node),
                                     ref_node_xyz(ref_node, 1, node),
                                     primitive),
          "coax");
      rho = primitive[0];
      u = primitive[1];
      v = primitive[2];
      w = primitive[3];
      pressure = primitive[4];
      mach = sqrt(u * u + v * v + w * w) / sqrt(1.4 * pressure / rho);
      scalar[node] = mach;
    } else {
      printf("%s: %d: %s %s\n", __FILE__, __LINE__, "unknown user function",
             function_name);
      return REF_NOT_FOUND;
    }
  }
  return REF_SUCCESS;
}